

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O0

TRIPLEYCbCr ** __thiscall
MovingAveradgeFilter::apply_filter
          (MovingAveradgeFilter *this,TRIPLEYCbCr **mrx,int h,int w,int radius,double sigma)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  TRIPLEYCbCr **mrxf_00;
  TRIPLEYCbCr *pTVar4;
  int local_44;
  int local_40;
  int j;
  int i_1;
  int i;
  TRIPLEYCbCr **mrxf;
  double sigma_local;
  int radius_local;
  int w_local;
  int h_local;
  TRIPLEYCbCr **mrx_local;
  MovingAveradgeFilter *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)h;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  mrxf_00 = (TRIPLEYCbCr **)operator_new__(uVar3);
  for (j = 0; local_40 = radius, j < h; j = j + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)w;
    uVar3 = SUB168(auVar2 * ZEXT816(3),0);
    if (SUB168(auVar2 * ZEXT816(3),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pTVar4 = (TRIPLEYCbCr *)operator_new__(uVar3);
    mrxf_00[j] = pTVar4;
    memset(mrxf_00[j],0,(long)w * 3);
  }
  for (; local_44 = radius, local_40 < h - radius; local_40 = local_40 + 1) {
    for (; local_44 < w - radius; local_44 = local_44 + 1) {
      moving_averadge(this,mrxf_00,mrx,local_40,local_44,radius);
    }
  }
  return mrxf_00;
}

Assistant:

TRIPLEYCbCr **MovingAveradgeFilter::apply_filter(TRIPLEYCbCr **mrx, int h, int w, int radius, double sigma) {
    TRIPLEYCbCr **mrxf = new TRIPLEYCbCr *[h];
    for (int i = 0; i < h; i++) {
        mrxf[i] = new TRIPLEYCbCr[w];
        memset(mrxf[i], 0, sizeof(TRIPLEYCbCr) * w);
    }
    for (int i = radius; i < h - radius; i++) {
        for (int j = radius; j < w - radius; j++) {
            moving_averadge(&mrxf[0], mrx, i, j, radius);
        }
    }
    return mrxf;
}